

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rel-pos.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined2 uVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  ggml_cgraph *gf_2;
  ggml_cgraph *gf;
  ggml_tensor *out;
  int i_1;
  float *out_inplace_d;
  float *in_d;
  ggml_tensor *out_inplace;
  ggml_tensor *in;
  ggml_tensor *rh_f32;
  ggml_tensor *rw_f32;
  ggml_tensor *rh;
  ggml_tensor *rw;
  ggml_fp16_t *t_d_2;
  ggml_tensor *t_2;
  ggml_fp16_t *t_d;
  ggml_tensor *t;
  ggml_context *ctx;
  float expected_out [4] [9];
  int i;
  ggml_fp16_t buf_f16 [1024];
  int ne2;
  void *pvVar14;
  float *expected_t_d;
  ggml_tensor *t_00;
  int local_924;
  undefined1 local_8b8 [156];
  int local_81c;
  undefined2 local_818;
  undefined1 auStack_816 [2066];
  undefined4 local_4;
  
  local_4 = 0;
  for (local_81c = 0; local_81c < 0x400; local_81c = local_81c + 1) {
    auVar13._0_4_ = (float)local_81c;
    auVar13._4_12_ = in_ZMM0._4_12_;
    uVar1 = ggml_fp32_to_fp16(auVar13._0_8_);
    in_ZMM0._8_56_ = extraout_var;
    in_ZMM0._0_8_ = extraout_XMM0_Qa;
    (&local_818)[local_81c] = uVar1;
  }
  memcpy(local_8b8,&DAT_00102030,0x90);
  pgVar2 = (ggml_tensor *)make_ctx();
  lVar3 = ggml_new_tensor_2d(pgVar2,1,3);
  pvVar14 = *(void **)(lVar3 + 0xf8);
  sVar4 = ggml_nbytes(lVar3);
  memcpy(pvVar14,&local_818,sVar4);
  lVar5 = ggml_new_tensor_2d(pgVar2,1,3);
  pvVar14 = *(void **)(lVar5 + 0xf8);
  expected_t_d = (float *)auStack_816;
  sVar4 = ggml_nbytes(lVar5);
  memcpy(pvVar14,expected_t_d,sVar4);
  uVar6 = ggml_get_rel_pos(pgVar2,lVar3,2);
  uVar7 = ggml_get_rel_pos(pgVar2,lVar5,2);
  t_00 = pgVar2;
  uVar8 = ggml_new_tensor_3d(pgVar2,0,3,2);
  uVar6 = ggml_cpy(t_00,uVar6,uVar8);
  uVar8 = ggml_new_tensor_3d(pgVar2,0,3,2);
  uVar7 = ggml_cpy(pgVar2,uVar7,uVar8);
  lVar9 = ggml_new_tensor_2d(pgVar2,0,9,4);
  lVar10 = ggml_new_tensor_2d(pgVar2,0,9,4);
  lVar3 = *(long *)(lVar9 + 0xf8);
  lVar5 = *(long *)(lVar10 + 0xf8);
  local_924 = 0;
  while( true ) {
    lVar11 = ggml_nelements(lVar9);
    if (lVar11 <= local_924) break;
    *(undefined4 *)(lVar3 + (long)local_924 * 4) = 0x3f800000;
    *(undefined4 *)(lVar5 + (long)local_924 * 4) = 0x3f800000;
    local_924 = local_924 + 1;
  }
  uVar8 = ggml_add_rel_pos(pgVar2,lVar9,uVar6,uVar7);
  uVar12 = ggml_new_graph(pgVar2);
  ggml_build_forward_expand(uVar12,uVar8);
  ggml_graph_compute_with_ctx(pgVar2,uVar12,1);
  uVar6 = ggml_add_rel_pos_inplace(pgVar2,lVar10,uVar6,uVar7);
  uVar7 = ggml_new_graph(pgVar2);
  ggml_build_forward_expand(uVar7,uVar6);
  ggml_graph_compute_with_ctx(pgVar2,uVar7,1);
  ne2 = (int)((ulong)&local_818 >> 0x20);
  check_tensor(t_00,expected_t_d,(int)((ulong)pvVar14 >> 0x20),(int)pvVar14,ne2);
  check_tensor(t_00,expected_t_d,(int)((ulong)pvVar14 >> 0x20),(int)pvVar14,ne2);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
    ggml_fp16_t buf_f16[1024];
    for (int i = 0; i < 1024; ++i) {
        buf_f16[i] = ggml_fp32_to_fp16((float)i);
    }

    float expected_out[4][9] = {
        { 8.0, 9.0, 10.0, 9.0, 10.0, 11.0, 10.0, 11.0, 12.0 },
        { 2.0, 3.0, 4.0, 3.0, 4.0, 5.0, 4.0, 5.0, 6.0 },
        { 14.0, 15.0, 16.0, 15.0, 16.0, 17.0, 16.0, 17.0, 18.0 },
        { 8.0, 9.0, 10.0, 9.0, 10.0, 11.0, 10.0, 11.0, 12.0 },
    };

    {
        struct ggml_context * ctx = make_ctx();


        struct ggml_tensor * t = ggml_new_tensor_2d(ctx, GGML_TYPE_F16, 3, 3);
        ggml_fp16_t* t_d = (ggml_fp16_t*)t->data;
        memcpy(t_d, buf_f16, ggml_nbytes(t));

        struct ggml_tensor * t_2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F16, 3, 3);
        ggml_fp16_t* t_d_2 = (ggml_fp16_t*)t_2->data;
        memcpy(t_d_2, buf_f16 + 1, ggml_nbytes(t_2));

        struct ggml_tensor * rw = ggml_get_rel_pos(ctx, t, 2, 2);
        struct ggml_tensor * rh = ggml_get_rel_pos(ctx, t_2, 2, 2);

        struct ggml_tensor * rw_f32 = ggml_cpy(ctx, rw, ggml_new_tensor_3d(ctx, GGML_TYPE_F32, 3, 2, 2));
        struct ggml_tensor * rh_f32 = ggml_cpy(ctx, rh, ggml_new_tensor_3d(ctx, GGML_TYPE_F32, 3, 2, 2));

        struct ggml_tensor * in = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 9, 4);
        struct ggml_tensor * out_inplace = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 9, 4);
        float * in_d          = (float*)in->data;
        float * out_inplace_d = (float*)out_inplace->data;
        for (int i = 0; i < ggml_nelements(in); ++i) {
            in_d[i]          = 1.f;
            out_inplace_d[i] = 1.f;
        }

        struct ggml_tensor * out = ggml_add_rel_pos(ctx, in, rw_f32, rh_f32);
        struct ggml_cgraph * gf = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf, out);
        ggml_graph_compute_with_ctx(ctx, gf, 1);

        out_inplace = ggml_add_rel_pos_inplace(ctx, out_inplace, rw_f32, rh_f32);
        struct ggml_cgraph * gf_2 = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf_2, out_inplace);
        ggml_graph_compute_with_ctx(ctx, gf_2, 1);

        check_tensor(out, (float*)expected_out, 9, 4, 1);
        check_tensor(out_inplace, (float*)expected_out, 9, 4, 1);
    }

    return 0;
}